

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::AlreadyConnectedToAddress(CConnman *this,CAddress *addr)

{
  CNode *pCVar1;
  long in_FS_OFFSET;
  bool bVar2;
  string local_68;
  direct_or_indirect local_48;
  uint local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_48.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)addr);
  local_30._0_4_ = (addr->super_CService).super_CNetAddr.m_net;
  local_30._4_4_ = (addr->super_CService).super_CNetAddr.m_scope_id;
  pCVar1 = FindNode(this,(CNetAddr *)&local_48.indirect_contents);
  bVar2 = true;
  if (pCVar1 == (CNode *)0x0) {
    CService::ToStringAddrPort_abi_cxx11_(&local_68,&addr->super_CService);
    pCVar1 = FindNode(this,&local_68);
    bVar2 = pCVar1 != (CNode *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x10 < local_38) {
    free(local_48.indirect_contents.indirect);
    local_48.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CConnman::AlreadyConnectedToAddress(const CAddress& addr)
{
    return FindNode(static_cast<CNetAddr>(addr)) || FindNode(addr.ToStringAddrPort());
}